

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O2

void Fraig_DetectFanoutFreeCone_rec
               (Fraig_Node_t *pNode,Fraig_NodeVec_t *vSuper,Fraig_NodeVec_t *vInside,int fFirst)

{
  int iVar1;
  Fraig_Node_t *p;
  
  p = (Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  if (((fFirst != 0) || (p->nRefs < 2)) && (iVar1 = Fraig_NodeIsVar(p), iVar1 == 0)) {
    Fraig_DetectFanoutFreeCone_rec(p->p1,vSuper,vInside,0);
    Fraig_DetectFanoutFreeCone_rec(p->p2,vSuper,vInside,0);
    vSuper = vInside;
  }
  Fraig_NodeVecPushUnique(vSuper,p);
  return;
}

Assistant:

void Fraig_DetectFanoutFreeCone_rec( Fraig_Node_t * pNode, Fraig_NodeVec_t * vSuper, Fraig_NodeVec_t * vInside, int fFirst )
{
    // make the pointer regular
    pNode = Fraig_Regular(pNode);
    // if the new node is complemented or a PI, another gate begins
    if ( (!fFirst && pNode->nRefs > 1) || Fraig_NodeIsVar(pNode) )
    {
        Fraig_NodeVecPushUnique( vSuper, pNode );
        return;
    }
    // go through the branches
    Fraig_DetectFanoutFreeCone_rec( pNode->p1, vSuper, vInside, 0 );
    Fraig_DetectFanoutFreeCone_rec( pNode->p2, vSuper, vInside, 0 );
    // add the node
    Fraig_NodeVecPushUnique( vInside, pNode );
}